

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void StripWhiteSpace(string *str)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int local_1c;
  int local_18;
  int last;
  int first;
  int str_length;
  string *str_local;
  
  last = std::__cxx11::string::length();
  local_18 = 0;
  while( true ) {
    bVar4 = false;
    if (local_18 < last) {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)str);
      iVar1 = isspace((int)*pcVar3);
      bVar4 = iVar1 != 0;
    }
    if (!bVar4) break;
    local_18 = local_18 + 1;
  }
  if (local_18 == last) {
    std::__cxx11::string::clear();
  }
  else {
    local_1c = last;
    if (0 < local_18) {
      std::__cxx11::string::erase((ulong)str,0);
      last = last - local_18;
      local_1c = last;
    }
    do {
      iVar1 = local_1c;
      local_1c = iVar1 + -1;
      bVar4 = false;
      if (-1 < local_1c) {
        pcVar3 = (char *)std::__cxx11::string::at((ulong)str);
        iVar2 = isspace((int)*pcVar3);
        bVar4 = iVar2 != 0;
      }
    } while (bVar4);
    if ((local_1c != last + -1) && (-1 < local_1c)) {
      std::__cxx11::string::erase((ulong)str,(long)iVar1);
    }
  }
  return;
}

Assistant:

inline void StripWhiteSpace(std::string* str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, std::string::npos);
  }
}